

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O0

void __thiscall gvr::anon_unknown_3::PLYProperty::~PLYProperty(PLYProperty *this)

{
  long in_RDI;
  
  if (*(long **)(in_RDI + 0x30) != (long *)0x0) {
    (**(code **)(**(long **)(in_RDI + 0x30) + 8))();
  }
  std::__cxx11::string::~string((string *)(in_RDI + 8));
  return;
}

Assistant:

PLYProperty::~PLYProperty()
{
  delete value;
}